

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int sort_5_3::heap_sort_3(int *a,int n)

{
  code *pcVar1;
  int local_1c;
  int local_18;
  int j;
  int i;
  int n_local;
  int *a_local;
  
  local_18 = n / 2;
  while (local_18 = local_18 + -1, -1 < local_18) {
    adjheap_3(a,local_18,n);
  }
  for (local_1c = n + -1; -1 < local_1c; local_1c = local_1c + -1) {
    swap_(a,a + local_1c);
    adjheap_3(a,0,local_1c);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int heap_sort_3(int *a, int n) {
        for (int i = n / 2 - 1; i >= 0; i--)
            adjheap_3(a, i, n);

        for (int j = n - 1; j >= 0; j--) {
            swap_(&a[0], &a[j]);
            adjheap_3(a, 0, j);
        }

    }